

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choices.cpp
# Opt level: O3

long Random::random(void)

{
  uint uVar1;
  ulong uVar2;
  long extraout_RAX;
  size_t __i;
  long lVar3;
  random_device rd;
  random_device local_1390;
  
  if (seeded_ == '\0') {
    std::random_device::random_device(&local_1390);
    uVar1 = std::random_device::_M_getval();
    uVar2 = (ulong)uVar1;
    lVar3 = 1;
    gen_._0_8_ = uVar2;
    do {
      uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar3);
      *(ulong *)(gen_ + lVar3 * 8) = uVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x270);
    gen_._4992_8_ = 0x270;
    seeded_ = '\x01';
    std::random_device::_M_fini();
  }
  std::
  generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)gen_);
  return extraout_RAX;
}

Assistant:

double Random::random() {
  if (!seeded_) {
    std::random_device rd;
    gen_.seed(rd());
    seeded_ = true;
  }
  return dis_(gen_);
}